

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O0

void __thiscall libchars::commands::deactivate_all_sets(commands *this)

{
  bool bVar1;
  pointer ppVar2;
  command_set *C_set;
  _Self local_18;
  iterator csi;
  commands *this_local;
  
  csi._M_node = (_Base_ptr)this;
  local_18._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libchars::command_set,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libchars::command_set>_>_>
       ::begin(&this->C_sets);
  while( true ) {
    C_set = (command_set *)
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libchars::command_set,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libchars::command_set>_>_>
            ::end(&this->C_sets);
    bVar1 = std::operator!=(&local_18,(_Self *)&C_set);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libchars::command_set>_>
             ::operator->(&local_18);
    command_set::deactivate(&ppVar2->second);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libchars::command_set>_>
    ::operator++(&local_18);
  }
  return;
}

Assistant:

void commands::deactivate_all_sets()
    {
        //NOTE: C_set_default not deactivated
        command_sets_t::iterator csi = C_sets.begin();
        while (csi != C_sets.end()) {
            command_set &C_set = csi->second;
            C_set.deactivate();
            ++csi;
        }
    }